

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<nanoNet::DataPoint> __l_11;
  reference pvVar1;
  ostream *poVar2;
  float fVar3;
  DataPoint *local_4c8;
  allocator<float> local_419;
  float local_418 [2];
  iterator local_410;
  size_type local_408;
  vector<float,_std::allocator<float>_> local_400;
  vector_type local_3e8;
  allocator<float> local_3c9;
  float local_3c8 [2];
  iterator local_3c0;
  size_type local_3b8;
  vector<float,_std::allocator<float>_> local_3b0;
  vector_type local_398;
  allocator<float> local_379;
  float local_378 [2];
  iterator local_370;
  size_type local_368;
  vector<float,_std::allocator<float>_> local_360;
  vector_type local_348;
  allocator<float> local_329;
  float local_328 [2];
  iterator local_320;
  size_type local_318;
  vector<float,_std::allocator<float>_> local_310;
  vector_type local_2f8;
  anon_class_4_1_54a3980b local_2e0;
  anon_class_1_0_00000001 local_2d9;
  anon_class_4_1_54a3980b rnd;
  anon_class_1_0_00000001 rnd_base;
  allocator<nanoNet::DataPoint> local_2c0;
  undefined1 local_2bf;
  undefined1 local_2be;
  allocator<float> local_2bd;
  float local_2bc;
  iterator local_2b8;
  size_type local_2b0;
  allocator<float> local_2a1;
  float local_2a0 [2];
  iterator local_298;
  size_type local_290;
  undefined1 local_286;
  allocator<float> local_285;
  float local_284;
  iterator local_280;
  size_type local_278;
  allocator<float> local_269;
  float local_268 [2];
  iterator local_260;
  size_type local_258;
  undefined1 local_24e;
  allocator<float> local_24d;
  float local_24c;
  iterator local_248;
  size_type local_240;
  allocator<float> local_231;
  float local_230 [2];
  iterator local_228;
  size_type local_220;
  undefined1 local_216;
  allocator<float> local_215;
  float local_214;
  iterator local_210;
  size_type local_208;
  allocator<float> local_1f9;
  float local_1f8 [2];
  iterator local_1f0;
  size_type local_1e8;
  DataPoint *local_1e0;
  DataPoint local_1d8;
  vector<float,_std::allocator<float>_> local_1a8;
  vector<float,_std::allocator<float>_> vStack_190;
  vector<float,_std::allocator<float>_> local_178;
  vector<float,_std::allocator<float>_> vStack_160;
  vector<float,_std::allocator<float>_> local_148;
  vector<float,_std::allocator<float>_> vStack_130;
  iterator local_118;
  pointer local_110;
  DataSet data;
  Trainer trainer;
  NeuralNetworkLayer local_d0;
  Which local_78;
  ActivationFunction local_74;
  NeuralNetworkLayer local_70;
  undefined1 local_28 [8];
  NeuralNetwork network;
  
  network.m_layers.
  super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  nanoNet::NeuralNetwork::NeuralNetwork((NeuralNetwork *)local_28);
  local_78 = Relu;
  nanoNet::ActivationFunction::ActivationFunction(&local_74,&local_78);
  nanoNet::NeuralNetworkLayer::NeuralNetworkLayer(&local_70,2,8,&local_74);
  nanoNet::NeuralNetwork::addLayer((NeuralNetwork *)local_28,&local_70);
  nanoNet::NeuralNetworkLayer::~NeuralNetworkLayer(&local_70);
  trainer.learning_rate = 4.2039e-45;
  nanoNet::ActivationFunction::ActivationFunction
            ((ActivationFunction *)&trainer.field_0x14,(Which *)&trainer.learning_rate);
  nanoNet::NeuralNetworkLayer::NeuralNetworkLayer
            (&local_d0,8,1,(ActivationFunction *)&trainer.field_0x14);
  nanoNet::NeuralNetwork::addLayer((NeuralNetwork *)local_28,&local_d0);
  nanoNet::NeuralNetworkLayer::~NeuralNetworkLayer(&local_d0);
  data.super__Vector_base<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2710;
  trainer.epoch_count = 2;
  trainer.batch_size._0_4_ = 0x3b03126f;
  local_2bf = 1;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  local_1f0 = local_1f8;
  local_1e8 = 2;
  local_1e0 = &local_1d8;
  std::allocator<float>::allocator(&local_1f9);
  __l_10._M_len = local_1e8;
  __l_10._M_array = local_1f0;
  std::vector<float,_std::allocator<float>_>::vector(&local_1d8.input,__l_10,&local_1f9);
  local_216 = 1;
  local_214 = 0.0;
  local_210 = &local_214;
  local_208 = 1;
  std::allocator<float>::allocator(&local_215);
  __l_09._M_len = local_208;
  __l_09._M_array = local_210;
  std::vector<float,_std::allocator<float>_>::vector(&local_1d8.output,__l_09,&local_215);
  local_216 = 0;
  local_230[0] = 0.0;
  local_230[1] = 1.0;
  local_228 = local_230;
  local_220 = 2;
  local_1e0 = (DataPoint *)&local_1a8;
  std::allocator<float>::allocator(&local_231);
  __l_08._M_len = local_220;
  __l_08._M_array = local_228;
  std::vector<float,_std::allocator<float>_>::vector(&local_1a8,__l_08,&local_231);
  local_24e = 1;
  local_24c = 1.0;
  local_248 = &local_24c;
  local_240 = 1;
  std::allocator<float>::allocator(&local_24d);
  __l_07._M_len = local_240;
  __l_07._M_array = local_248;
  std::vector<float,_std::allocator<float>_>::vector(&vStack_190,__l_07,&local_24d);
  local_24e = 0;
  local_268[0] = 1.0;
  local_268[1] = 0.0;
  local_260 = local_268;
  local_258 = 2;
  local_1e0 = (DataPoint *)&local_178;
  std::allocator<float>::allocator(&local_269);
  __l_06._M_len = local_258;
  __l_06._M_array = local_260;
  std::vector<float,_std::allocator<float>_>::vector(&local_178,__l_06,&local_269);
  local_286 = 1;
  local_284 = 1.0;
  local_280 = &local_284;
  local_278 = 1;
  std::allocator<float>::allocator(&local_285);
  __l_05._M_len = local_278;
  __l_05._M_array = local_280;
  std::vector<float,_std::allocator<float>_>::vector(&vStack_160,__l_05,&local_285);
  local_286 = 0;
  local_2a0[0] = 1.0;
  local_2a0[1] = 1.0;
  local_298 = local_2a0;
  local_290 = 2;
  local_1e0 = (DataPoint *)&local_148;
  std::allocator<float>::allocator(&local_2a1);
  __l_04._M_len = local_290;
  __l_04._M_array = local_298;
  std::vector<float,_std::allocator<float>_>::vector(&local_148,__l_04,&local_2a1);
  local_2be = 1;
  local_2bc = 0.0;
  local_2b8 = &local_2bc;
  local_2b0 = 1;
  std::allocator<float>::allocator(&local_2bd);
  __l_03._M_len = local_2b0;
  __l_03._M_array = local_2b8;
  std::vector<float,_std::allocator<float>_>::vector(&vStack_130,__l_03,&local_2bd);
  local_2be = 0;
  local_2bf = 0;
  local_118 = &local_1d8;
  local_110 = (pointer)0x4;
  std::allocator<nanoNet::DataPoint>::allocator(&local_2c0);
  __l_11._M_len = (size_type)local_110;
  __l_11._M_array = local_118;
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::vector
            ((vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> *)
             &stack0xfffffffffffffef8,__l_11,&local_2c0);
  std::allocator<nanoNet::DataPoint>::~allocator(&local_2c0);
  local_4c8 = (DataPoint *)&stack0xfffffffffffffee8;
  do {
    local_4c8 = local_4c8 + -1;
    nanoNet::DataPoint::~DataPoint(local_4c8);
  } while (local_4c8 != &local_1d8);
  std::allocator<float>::~allocator(&local_2bd);
  std::allocator<float>::~allocator(&local_2a1);
  std::allocator<float>::~allocator(&local_285);
  std::allocator<float>::~allocator(&local_269);
  std::allocator<float>::~allocator(&local_24d);
  std::allocator<float>::~allocator(&local_231);
  std::allocator<float>::~allocator(&local_215);
  std::allocator<float>::~allocator(&local_1f9);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::vector
            ((vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> *)&rnd,
             (vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> *)
             &stack0xfffffffffffffef8);
  nanoNet::Trainer::train
            ((Trainer *)
             &data.super__Vector_base<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(NeuralNetwork *)local_28,
             (DataSet *)&rnd);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::~vector
            ((vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> *)&rnd);
  local_2e0 = main::anon_class_1_0_00000001::operator()(&local_2d9,2.0);
  std::operator<<((ostream *)&std::cout,'\n');
  local_328[0] = 0.0;
  local_328[1] = 0.0;
  local_320 = local_328;
  local_318 = 2;
  std::allocator<float>::allocator(&local_329);
  __l_02._M_len = local_318;
  __l_02._M_array = local_320;
  std::vector<float,_std::allocator<float>_>::vector(&local_310,__l_02,&local_329);
  nanoNet::NeuralNetwork::predict(&local_2f8,(NeuralNetwork *)local_28,&local_310);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&local_2f8,0);
  fVar3 = anon_class_4_1_54a3980b::operator()(&local_2e0,*pvVar1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar3);
  std::operator<<(poVar2,'\n');
  std::vector<float,_std::allocator<float>_>::~vector(&local_2f8);
  std::vector<float,_std::allocator<float>_>::~vector(&local_310);
  std::allocator<float>::~allocator(&local_329);
  local_378[0] = 0.0;
  local_378[1] = 1.0;
  local_370 = local_378;
  local_368 = 2;
  std::allocator<float>::allocator(&local_379);
  __l_01._M_len = local_368;
  __l_01._M_array = local_370;
  std::vector<float,_std::allocator<float>_>::vector(&local_360,__l_01,&local_379);
  nanoNet::NeuralNetwork::predict(&local_348,(NeuralNetwork *)local_28,&local_360);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&local_348,0);
  fVar3 = anon_class_4_1_54a3980b::operator()(&local_2e0,*pvVar1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar3);
  std::operator<<(poVar2,'\n');
  std::vector<float,_std::allocator<float>_>::~vector(&local_348);
  std::vector<float,_std::allocator<float>_>::~vector(&local_360);
  std::allocator<float>::~allocator(&local_379);
  local_3c8[0] = 1.0;
  local_3c8[1] = 0.0;
  local_3c0 = local_3c8;
  local_3b8 = 2;
  std::allocator<float>::allocator(&local_3c9);
  __l_00._M_len = local_3b8;
  __l_00._M_array = local_3c0;
  std::vector<float,_std::allocator<float>_>::vector(&local_3b0,__l_00,&local_3c9);
  nanoNet::NeuralNetwork::predict(&local_398,(NeuralNetwork *)local_28,&local_3b0);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&local_398,0);
  fVar3 = anon_class_4_1_54a3980b::operator()(&local_2e0,*pvVar1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar3);
  std::operator<<(poVar2,'\n');
  std::vector<float,_std::allocator<float>_>::~vector(&local_398);
  std::vector<float,_std::allocator<float>_>::~vector(&local_3b0);
  std::allocator<float>::~allocator(&local_3c9);
  local_418[0] = 1.0;
  local_418[1] = 1.0;
  local_410 = local_418;
  local_408 = 2;
  std::allocator<float>::allocator(&local_419);
  __l._M_len = local_408;
  __l._M_array = local_410;
  std::vector<float,_std::allocator<float>_>::vector(&local_400,__l,&local_419);
  nanoNet::NeuralNetwork::predict(&local_3e8,(NeuralNetwork *)local_28,&local_400);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&local_3e8,0);
  fVar3 = anon_class_4_1_54a3980b::operator()(&local_2e0,*pvVar1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar3);
  std::operator<<(poVar2,'\n');
  std::vector<float,_std::allocator<float>_>::~vector(&local_3e8);
  std::vector<float,_std::allocator<float>_>::~vector(&local_400);
  std::allocator<float>::~allocator(&local_419);
  std::operator<<((ostream *)&std::cout,'\n');
  network.m_layers.
  super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::~vector
            ((vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> *)
             &stack0xfffffffffffffef8);
  nanoNet::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)local_28);
  return network.m_layers.
         super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {

    NeuralNetwork network;

    network.addLayer({2, 8, {ActivationFunction::Which::Relu}});
    network.addLayer({8, 1, {ActivationFunction::Which::Linear}});

    // 10000 epochs, batch size = 2, training rate = 0.002
    Trainer trainer { 10000 , 2 , 0.002 };

    Trainer::DataSet data {{
        {{{0.0, 0.0}},{{0.0}}},
        {{{0.0, 1.0}},{{1.0}}},
        {{{1.0, 0.0}},{{1.0}}},
        {{{1.0, 1.0}},{{0.0}}}
    }};

    // stochastic gradient descent
    trainer.train ( network, data );

    auto rnd_base = []( float k ){ return [=]( float x ){ return ( int(x*k+0.5) ) / k; }; };
    auto rnd = rnd_base(2);

    std::cout << '\n';
    std::cout << rnd(network.predict({{0.0, 0.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{0.0, 1.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{1.0, 0.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{1.0, 1.0}})[0]) << '\n';
    std::cout << '\n';

    return 0;
}